

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_preTestActionWillEnableMultipleComparatorsToTheGlobalMockSupportSpace_Test::testBody
          (TEST_MockPlugin_preTestActionWillEnableMultipleComparatorsToTheGlobalMockSupportSpace_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UtestShell *pUVar3;
  size_t sVar4;
  TestTerminator *pTVar5;
  SimpleString local_160;
  SimpleString local_150;
  SimpleString local_140;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  MockNamedValueComparator local_20;
  DummyComparator comparator2;
  DummyComparator comparator;
  TEST_MockPlugin_preTestActionWillEnableMultipleComparatorsToTheGlobalMockSupportSpace_Test
  *this_local;
  
  DummyComparator::DummyComparator(&comparator2);
  DummyComparator::DummyComparator((DummyComparator *)&local_20);
  SimpleString::SimpleString(local_40,"myType");
  MockSupportPlugin::installComparator
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,local_40,
             &comparator2.super_MockNamedValueComparator);
  SimpleString::~SimpleString(local_40);
  SimpleString::SimpleString(&local_50,"myOtherType");
  MockSupportPlugin::installComparator
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,&local_50,&local_20);
  SimpleString::~SimpleString(&local_50);
  MockSupportPlugin::preTestAction
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_70);
  SimpleString::SimpleString(&local_80,"myType");
  SimpleString::SimpleString(&local_90,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_80,&local_90,&comparator2);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_a0,"");
  pMVar2 = mock(&local_a0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_b0);
  SimpleString::SimpleString(&local_c0,"myOtherType");
  SimpleString::SimpleString(&local_d0,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_c0,&local_d0,&comparator2);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_e0,"");
  pMVar2 = mock(&local_e0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_f0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_f0);
  SimpleString::SimpleString(&local_100,"myType");
  SimpleString::SimpleString(&local_110,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_01,iVar1),&local_100,&local_110,&comparator2);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::SimpleString(&local_120,"");
  pMVar2 = mock(&local_120,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_130,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_130);
  SimpleString::SimpleString(&local_140,"myOtherType");
  SimpleString::SimpleString(&local_150,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_02,iVar1),&local_140,&local_150,&comparator2);
  SimpleString::~SimpleString(&local_150);
  SimpleString::~SimpleString(&local_140);
  SimpleString::~SimpleString(&local_130);
  SimpleString::~SimpleString(&local_120);
  SimpleString::SimpleString(&local_160,"");
  pMVar2 = mock(&local_160,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_160);
  pUVar3 = UtestShell::getCurrent();
  sVar4 = TestResult::getFailureCount((this->super_TEST_GROUP_CppUTestGroupMockPlugin).result);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,sVar4,"LONGS_EQUAL(0, result->getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x9e,pTVar5);
  MockSupportPlugin::clear(&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin);
  DummyComparator::~DummyComparator((DummyComparator *)&local_20);
  DummyComparator::~DummyComparator(&comparator2);
  return;
}

Assistant:

TEST(MockPlugin, preTestActionWillEnableMultipleComparatorsToTheGlobalMockSupportSpace)
{
    DummyComparator comparator;
    DummyComparator comparator2;
    plugin.installComparator("myType", comparator);
    plugin.installComparator("myOtherType", comparator2);

    plugin.preTestAction(*test, *result);
    mock().expectOneCall("foo").withParameterOfType("myType", "name", &comparator);
    mock().expectOneCall("foo").withParameterOfType("myOtherType", "name", &comparator);
    mock().actualCall("foo").withParameterOfType("myType", "name", &comparator);
    mock().actualCall("foo").withParameterOfType("myOtherType", "name", &comparator);

    mock().checkExpectations();
    LONGS_EQUAL(0, result->getFailureCount());

    plugin.clear();
}